

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Nonnull<CordRepBtree_*> absl::lts_20250127::ForceBtree(CordRep *rep)

{
  bool bVar1;
  CordRep *rep_00;
  undefined8 local_18;
  CordRep *rep_local;
  
  bVar1 = cord_internal::CordRep::IsBtree(rep);
  if (bVar1) {
    local_18 = cord_internal::CordRep::btree(rep);
  }
  else {
    rep_00 = cord_internal::RemoveCrcNode(rep);
    local_18 = cord_internal::CordRepBtree::Create(rep_00);
  }
  return local_18;
}

Assistant:

static absl::Nonnull<CordRepBtree*> ForceBtree(CordRep* rep) {
  return rep->IsBtree()
             ? rep->btree()
             : CordRepBtree::Create(cord_internal::RemoveCrcNode(rep));
}